

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SerializeWithCachedSizes
          (KNearestNeighborsClassifier *this,CodedOutputStream *output)

{
  uint32 uVar1;
  DefaultClassLabelUnion value;
  
  if (this->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0 &&
      this != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->nearestneighborsindex_->super_MessageLite,output);
  }
  if (this->numberofneighbors_ != (Int64Parameter *)0x0 &&
      this != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->numberofneighbors_->super_MessageLite,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x6e) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (*(char **)(this->DefaultClassLabel_).defaultint64label_,
               *(int *)((undefined8 *)(this->DefaultClassLabel_).defaultint64label_ + 1),SERIALIZE,
               "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
    if (this->_oneof_case_[1] == 0x6e) {
      value = this->DefaultClassLabel_;
    }
    else {
      value.defaultint64label_ =
           (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x6e,(string *)value,output)
    ;
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0x6f) {
    google::protobuf::internal::WireFormatLite::WriteInt64
              (0x6f,(this->DefaultClassLabel_).defaultint64label_,output);
  }
  uVar1 = this->_oneof_case_[2];
  if (uVar1 == 200) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->WeightingScheme_).uniformweighting_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[2];
  }
  if (uVar1 == 0xd2) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xd2,&((this->WeightingScheme_).uniformweighting_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.KNearestNeighborsClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
  if (this->has_nearestneighborsindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->nearestneighborsindex_, output);
  }

  // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
  if (this->has_numberofneighbors()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->numberofneighbors_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // string defaultStringLabel = 110;
  if (has_defaultstringlabel()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->defaultstringlabel().data(), this->defaultstringlabel().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.KNearestNeighborsClassifier.defaultStringLabel");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      110, this->defaultstringlabel(), output);
  }

  // int64 defaultInt64Label = 111;
  if (has_defaultint64label()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(111, this->defaultint64label(), output);
  }

  // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
  if (has_uniformweighting()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *WeightingScheme_.uniformweighting_, output);
  }

  // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
  if (has_inversedistanceweighting()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      210, *WeightingScheme_.inversedistanceweighting_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.KNearestNeighborsClassifier)
}